

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_first_step2.cpp
# Opt level: O2

bool __thiscall
ruckig::PositionFirstOrderStep2::get_profile(PositionFirstOrderStep2 *this,Profile *profile)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = this->pd;
  dVar2 = this->tf;
  (profile->t)._M_elems[2] = 0.0;
  (profile->t)._M_elems[0] = 0.0;
  (profile->t)._M_elems[1] = 0.0;
  (profile->t)._M_elems[3] = this->tf;
  (profile->t)._M_elems[4] = 0.0;
  (profile->t)._M_elems[5] = 0.0;
  (profile->t)._M_elems[6] = 0.0;
  bVar3 = Profile::
          check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                    (profile,this->tf,dVar1 / dVar2,this->_vMax,this->_vMin);
  return bVar3;
}

Assistant:

bool PositionFirstOrderStep2::get_profile(Profile& profile) {
    const double vf = pd / tf;

    profile.t[0] = 0;
    profile.t[1] = 0;
    profile.t[2] = 0;
    profile.t[3] = tf;
    profile.t[4] = 0;
    profile.t[5] = 0;
    profile.t[6] = 0;

    return profile.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(tf, vf, _vMax, _vMin);
}